

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O2

bool __thiscall
Clasp::Asp::LogicProgram::simplifyNormal
          (LogicProgram *this,Head_t ht,AtomSpan *head,LitSpan *body,RuleBuilder *out,SRule *meta)

{
  AtomState *this_00;
  Literal p;
  byte *pbVar1;
  uint uVar2;
  int *piVar3;
  PrgNode PVar4;
  uint lit;
  int iVar5;
  int iVar6;
  ValueRep VVar7;
  bool bVar8;
  uint32 uVar9;
  PrgAtom *a;
  Lit_t *pLVar10;
  long lVar11;
  LogicProgram *this_01;
  long lVar12;
  uint uVar13;
  LitSpan LVar14;
  
  Potassco::RuleBuilder::clear(out);
  Potassco::RuleBuilder::startBody(out);
  meta->hash = 0;
  meta->pos = 0;
  meta->bid = 0x40000000;
  piVar3 = body->first;
  this_00 = &this->atomState_;
  lVar11 = body->size << 2;
  for (lVar12 = 0; lVar11 != lVar12; lVar12 = lVar12 + 4) {
    uVar2 = *(uint *)((long)piVar3 + lVar12);
    uVar13 = -uVar2;
    if (0 < (int)uVar2) {
      uVar13 = uVar2;
    }
    if (0xfffffff < uVar13) {
      Potassco::fail(0x4b,
                     "bool Clasp::Asp::LogicProgram::simplifyNormal(Head_t, const Potassco::AtomSpan &, const Potassco::LitSpan &, RuleBuilder &, SRule &)"
                     ,0x712,"Potassco::atom(*it) < bodyId","Atom out of bounds",0);
    }
    this_01 = this;
    a = resize(this,uVar13);
    PVar4 = (a->super_PrgHead).super_PrgNode;
    uVar2 = *(uint *)((long)piVar3 + lVar12);
    iVar5 = (int)uVar2 >> 0x1f;
    iVar6 = iVar5 * -2;
    VVar7 = litVal(this_01,a,iVar6 == 0);
    if (VVar7 == '\x02') break;
    uVar13 = (uint)((ulong)PVar4 >> 0x1e) & 0x3ffffffc;
    p.rep_ = uVar13 + iVar5 * -2;
    bVar8 = AtomState::inBody(this_00,(Literal)(p.rep_ ^ 2));
    if (bVar8) break;
    if (VVar7 != '\x01') {
      bVar8 = AtomState::inBody(this_00,p);
      if (!bVar8) {
        AtomState::addToBody(this_00,p);
        uVar13 = uVar13 >> 2;
        lit = -uVar13;
        if (iVar6 == 0) {
          lit = uVar13;
        }
        Potassco::RuleBuilder::addGoal(out,lit);
        meta->pos = meta->pos - ((int)~uVar2 >> 0x1f);
        uVar9 = hashLit(p);
        meta->hash = meta->hash + uVar9;
      }
    }
  }
  LVar14 = Potassco::RuleBuilder::body(out);
  if (lVar11 == lVar12) {
    uVar9 = findBody(this,meta->hash,(Body_t)0x0,(uint32)LVar14.size,-1,(WeightLit_t *)0x0);
    meta->bid = uVar9;
    bVar8 = pushHead(this,ht,head,0,out);
  }
  else {
    meta->bid = 0x40000000;
    bVar8 = false;
  }
  pLVar10 = Potassco::RuleBuilder::lits_begin(out);
  for (lVar11 = 0; (uint32)LVar14.size != (uint32)lVar11; lVar11 = lVar11 + 1) {
    uVar2 = pLVar10[lVar11];
    uVar13 = -uVar2;
    if (0 < (int)uVar2) {
      uVar13 = uVar2;
    }
    if (uVar13 < (this->atomState_).state_.ebo_.size) {
      pbVar1 = (this_00->state_).ebo_.buf + uVar13;
      *pbVar1 = *pbVar1 & 0xe0;
    }
  }
  return bVar8;
}

Assistant:

bool LogicProgram::simplifyNormal(Head_t ht, const Potassco::AtomSpan& head, const Potassco::LitSpan& body, RuleBuilder& out, SRule& meta) {
	out.clear();
	out.startBody();
	meta = SRule();
	bool ok = true;
	for (Potassco::LitSpan::iterator it = Potassco::begin(body), end = Potassco::end(body); it != end; ++it) {
		POTASSCO_CHECK(Potassco::atom(*it) < bodyId, EOVERFLOW, "Atom out of bounds");
		PrgAtom* a = resize(Potassco::atom(*it));
		Literal  p = Literal(a->id(), *it < 0);// replace any eq atoms
		ValueRep v = litVal(a, !p.sign());
		if (v == value_false || atomState_.inBody(~p)) {
			ok = false;
			break;
		}
		else if (v != value_true  && !atomState_.inBody(p)) {
			atomState_.addToBody(p);
			out.addGoal(toInt(p));
			meta.pos  += !p.sign();
			meta.hash += hashLit(p);
		}
	}
	uint32_t bs = toU32(size(out.body()));
	meta.bid = ok ? findBody(meta.hash, Body_t::Normal, bs) : varMax;
	ok = ok && pushHead(ht, head, 0, out);
	for (const Potassco::Lit_t* it = out.lits_begin(); bs--;) {
		atomState_.clearRule(Potassco::atom(*it++));
	}
	return ok;
}